

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,BorderAgent *aBorderAgent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  ulong *puVar6;
  BorderAgent *extraout_RDX;
  BorderAgent *extraout_RDX_00;
  BorderAgent *extraout_RDX_01;
  BorderAgent *extraout_RDX_02;
  BorderAgent *extraout_RDX_03;
  BorderAgent *extraout_RDX_04;
  BorderAgent *extraout_RDX_05;
  BorderAgent *extraout_RDX_06;
  BorderAgent *extraout_RDX_07;
  ByteArray *aBytes;
  BorderAgent *extraout_RDX_08;
  BorderAgent *extraout_RDX_09;
  BorderAgent *extraout_RDX_10;
  BorderAgent *extraout_RDX_11;
  BorderAgent *extraout_RDX_12;
  BorderAgent *extraout_RDX_13;
  BorderAgent *extraout_RDX_14;
  BorderAgent *extraout_RDX_15;
  BorderAgent *extraout_RDX_16;
  ByteArray *aBytes_00;
  undefined8 uVar7;
  ulong uVar8;
  uint __len;
  string __str;
  string local_f0;
  string local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  undefined8 uStack_98;
  string local_90;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  ByteArray local_48;
  
  local_50 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this[1].mThreadAdministratorPasscode.field_2._M_local_buf[0] & 1U) != 0) {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Addr=","");
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_b0,
                        (ulong)(this->mContext).mNwkAliases.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = puVar3[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_d0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = plVar4[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p)
    ;
    aBorderAgent = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
      aBorderAgent = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      aBorderAgent = extraout_RDX_01;
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
      aBorderAgent = extraout_RDX_02;
    }
  }
  if ((this[1].mThreadAdministratorPasscode.field_2._M_local_buf[0] & 2U) != 0) {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Port=","");
    uVar2 = *(ushort *)
             &(this->mContext).mDomAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __len = 1;
    if (((9 < uVar2) && (__len = 2, 99 < uVar2)) && (__len = 3, 999 < uVar2)) {
      __len = 5 - (uVar2 < 10000);
    }
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_90._M_dataplus._M_p,__len,(uint)uVar2);
    uVar8 = 0xf;
    if (local_b0 != &local_a0) {
      uVar8 = local_a0;
    }
    if (uVar8 < local_90._M_string_length + local_a8) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        uVar7 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_90._M_string_length + local_a8) goto LAB_001d26a3;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
    }
    else {
LAB_001d26a3:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_d0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)psVar5 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = puVar3[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_f0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p)
    ;
    aBorderAgent = extraout_RDX_03;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
      aBorderAgent = extraout_RDX_04;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      aBorderAgent = extraout_RDX_05;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
      aBorderAgent = extraout_RDX_06;
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
      aBorderAgent = extraout_RDX_07;
    }
  }
  if ((this[1].mThreadAdministratorPasscode.field_2._M_local_buf[1] & 0x80U) != 0) {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Discriminator=","");
    utils::Hex_abi_cxx11_(&local_90,(utils *)&(this->mContext).mExportFiles,aBytes);
    uVar8 = 0xf;
    if (local_b0 != &local_a0) {
      uVar8 = local_a0;
    }
    if (uVar8 < local_90._M_string_length + local_a8) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar7 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_90._M_string_length + local_a8) goto LAB_001d2830;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
    }
    else {
LAB_001d2830:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_d0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)psVar5 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = puVar3[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_f0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p)
    ;
    aBorderAgent = extraout_RDX_08;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
      aBorderAgent = extraout_RDX_09;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      aBorderAgent = extraout_RDX_10;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
      aBorderAgent = extraout_RDX_11;
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
      aBorderAgent = extraout_RDX_12;
    }
  }
  if ((this[1].mThreadAdministratorPasscode.field_2._M_local_buf[0] & 4U) != 0) {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ThreadVersion=","");
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_b0,
                        (ulong)(this->mContext).mImportFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = puVar3[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_d0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = puVar3[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_f0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p)
    ;
    aBorderAgent = extraout_RDX_13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
      aBorderAgent = extraout_RDX_14;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      aBorderAgent = extraout_RDX_15;
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
      aBorderAgent = extraout_RDX_16;
    }
  }
  if ((this[1].mThreadAdministratorPasscode.field_2._M_local_buf[0] & 8U) != 0) {
    ToString_abi_cxx11_(&local_d0,
                        (Interpreter *)
                        &(this->mContext).mCommandKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(State *)aBorderAgent);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = puVar3[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_f0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if ((this[1].mThreadAdministratorPasscode.field_2._M_local_buf[0] & 0x10U) != 0) {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"NetworkName=","");
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_b0,
                        (ulong)(this->mContext).mCommandKeys.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = puVar3[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_d0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = puVar3[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_f0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
  }
  if ((this[1].mThreadAdministratorPasscode.field_2._M_local_buf[0] & 0x20U) == 0)
  goto LAB_001d2e72;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ExtendedPanId=","");
  utils::Encode<unsigned_long>
            (&local_48,
             (unsigned_long)
             (this->mRegistry).
             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  utils::Hex_abi_cxx11_(&local_f0,(utils *)&local_48,aBytes_00);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x2733b2);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_60 = *puVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar6;
    local_70 = (ulong *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    uVar7 = local_90.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_68 + local_90._M_string_length) {
    uVar8 = 0xf;
    if (local_70 != &local_60) {
      uVar8 = local_60;
    }
    if (uVar8 < local_68 + local_90._M_string_length) goto LAB_001d2d58;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_70,0,(char *)0x0,(ulong)local_90._M_dataplus._M_p);
  }
  else {
LAB_001d2d58:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
  }
  local_b0 = &local_a0;
  puVar6 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar6) {
    local_a0 = *puVar6;
    uStack_98 = puVar3[3];
  }
  else {
    local_a0 = *puVar6;
    local_b0 = (ulong *)*puVar3;
  }
  local_a8 = puVar3[1];
  *puVar3 = puVar6;
  puVar3[1] = 0;
  *(undefined1 *)puVar6 = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
  psVar5 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_8_ = puVar3[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_d0._M_string_length = puVar3[1];
  *puVar3 = psVar5;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
LAB_001d2e72:
  if ((this[1].mThreadAdministratorPasscode.field_2._M_local_buf[0] & 0x40U) != 0) {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"VendorName=","");
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_b0,
                        (ulong)(this->mThreadAdministratorPasscode)._M_dataplus._M_p);
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = puVar3[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_d0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = puVar3[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_f0._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
  }
  if ((this[1].mThreadAdministratorPasscode.field_2._M_local_buf[0] & 0x80U) != 0) {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ModelName=","");
    uVar8._0_1_ = this->mShouldExit;
    uVar8._1_1_ = this->mCancelCommand;
    uVar8._2_2_ = *(undefined2 *)&this->field_0xba;
    uVar8._4_4_ = this->mCancelPipe[0];
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,uVar8);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = plVar4[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_d0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = plVar4[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const BorderAgent &aBorderAgent)
{
    std::string ret;

#define BUILD_STRING(name, nameStr)                             \
    if (aBorderAgent.mPresentFlags & BorderAgent::k##name##Bit) \
    {                                                           \
        ret += std::string(#name "=") + nameStr + "\n";         \
    };

    BUILD_STRING(Addr, aBorderAgent.mAddr);
    BUILD_STRING(Port, std::to_string(aBorderAgent.mPort));
    BUILD_STRING(Discriminator, utils::Hex(aBorderAgent.mDiscriminator));
    BUILD_STRING(ThreadVersion, aBorderAgent.mThreadVersion);
    if (aBorderAgent.mPresentFlags & BorderAgent::kStateBit)
    {
        ret += ToString(aBorderAgent.mState) + "\n";
    }
    BUILD_STRING(NetworkName, aBorderAgent.mNetworkName);
    BUILD_STRING(ExtendedPanId, ToHex(aBorderAgent.mExtendedPanId));
    BUILD_STRING(VendorName, aBorderAgent.mVendorName);
    BUILD_STRING(ModelName, aBorderAgent.mModelName);

    // TODO(wgtdkp): more fields

#undef TO_STRING

    return ret;
}